

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileutils.c
# Opt level: O2

void write_other_cert(scep *s)

{
  long lVar1;
  int iVar2;
  X509 *a;
  X509_NAME *pXVar3;
  char *pcVar4;
  char *pcVar5;
  ASN1_INTEGER *x;
  FILE *fp;
  int iVar6;
  char buffer [1024];
  
  lVar1 = ((s->reply_p7->d).data)->flags;
  iVar6 = 0;
  do {
    iVar2 = OPENSSL_sk_num(lVar1);
    if (iVar2 <= iVar6) goto LAB_0010cdf3;
    a = (X509 *)OPENSSL_sk_value(lVar1,iVar6);
    pcVar5 = pname;
    if (v_flag != 0) {
      pXVar3 = X509_get_subject_name(a);
      pcVar4 = X509_NAME_oneline(pXVar3,buffer,0x400);
      printf("%s: found certificate with\n  subject: %s\n",pcVar5,pcVar4);
      pXVar3 = X509_get_issuer_name(a);
      pcVar5 = X509_NAME_oneline(pXVar3,buffer,0x400);
      printf("  issuer: %s\n",pcVar5);
    }
    x = X509_get_serialNumber(a);
    iVar2 = ASN1_INTEGER_cmp(x,(ASN1_INTEGER *)s->ias_getcert->serial);
    iVar6 = iVar6 + 1;
  } while (iVar2 != 0);
  if (a == (X509 *)0x0) {
LAB_0010cdf3:
    pcVar5 = "%s: cannot find certificate\n";
  }
  else {
    fp = fopen(w_char,"w");
    if (fp != (FILE *)0x0) {
      if (v_flag != 0) {
        printf("%s: certificate written as %s\n",pname,w_char);
      }
      if (d_flag != 0) {
        PEM_write_X509(_stdout,a);
      }
      iVar6 = PEM_write_X509(fp,a);
      if (iVar6 == 1) {
        fclose(fp);
        return;
      }
      fprintf(_stderr,"%s: error while writing certificate file\n",pname);
      ERR_print_errors_fp(_stderr);
      goto LAB_0010ce15;
    }
    pcVar5 = "%s: cannot open cert file for writing\n";
  }
  fprintf(_stderr,pcVar5,pname);
LAB_0010ce15:
  exit(0x5d);
}

Assistant:

void
write_other_cert(struct scep *s) {
	PKCS7			*p7;
	STACK_OF(X509)		*certs;
	X509			*cert = NULL;
	FILE			*fp;
	int			i;
	X509 *othercert = NULL;

	/* Get certs */
	p7 = s->reply_p7;
	certs = p7->d.sign->cert;
	
	/* Find cert */
	for (i = 0; i < sk_X509_num(certs); i++) {
		char buffer[1024];

		cert = sk_X509_value(certs, i);
		if (v_flag) {
			printf("%s: found certificate with\n"
				"  subject: %s\n", pname,
				X509_NAME_oneline(X509_get_subject_name(cert),
					buffer, sizeof(buffer)));
			printf("  issuer: %s\n", 
				X509_NAME_oneline(X509_get_issuer_name(cert),
					buffer, sizeof(buffer)));
		}
		/* The serial has to match to requested one */
		if (!ASN1_INTEGER_cmp(X509_get_serialNumber(cert),
				s->ias_getcert->serial)) {
				othercert = cert;	
				break;
		}	
	}
	if (othercert == NULL) {
		fprintf(stderr, "%s: cannot find certificate\n", pname);
		exit (SCEP_PKISTATUS_FILE);

	}
	/* Write PEM-formatted file: */
#ifdef WIN32
	if ((fopen_s(&fp, w_char, "w")))
#else
	if (!(fp = fopen(w_char, "w")))
#endif
	{
		fprintf(stderr, "%s: cannot open cert file for writing\n",
				pname);
		exit (SCEP_PKISTATUS_FILE);
	}
	if (v_flag)
		printf("%s: certificate written as %s\n", pname, w_char);
	if (d_flag)
		PEM_write_X509(stdout, othercert);
	if (PEM_write_X509(fp, othercert) != 1) {
		fprintf(stderr, "%s: error while writing certificate "
			"file\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_FILE);
	}
	(void)fclose(fp);
}